

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

FuncType * __thiscall wabt::Module::GetFuncType(Module *this,Var *var)

{
  FuncType *pFVar1;
  Var *var_local;
  Module *this_local;
  
  pFVar1 = GetFuncType(this,var);
  return pFVar1;
}

Assistant:

const FuncType* Module::GetFuncType(const Var& var) const {
  return const_cast<Module*>(this)->GetFuncType(var);
}